

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

EnumValueOptions * __thiscall
google::protobuf::EnumValueDescriptorProto::_internal_mutable_options
          (EnumValueDescriptorProto *this)

{
  EnumValueOptions *pEVar1;
  long in_RDI;
  EnumValueOptions *p;
  EnumValueDescriptorProto *in_stack_ffffffffffffffe0;
  
  *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) | 2;
  if (*(long *)(in_RDI + 0x20) == 0) {
    GetArenaNoVirtual(in_stack_ffffffffffffffe0);
    pEVar1 = MessageLite::CreateMaybeMessage<google::protobuf::EnumValueOptions>((Arena *)0x4e2a31);
    *(EnumValueOptions **)(in_RDI + 0x20) = pEVar1;
  }
  return *(EnumValueOptions **)(in_RDI + 0x20);
}

Assistant:

inline PROTOBUF_NAMESPACE_ID::EnumValueOptions* EnumValueDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000002u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<PROTOBUF_NAMESPACE_ID::EnumValueOptions>(GetArenaNoVirtual());
    options_ = p;
  }
  return options_;
}